

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertGreaterOrLessOrEqualNumber
               (UNITY_INT threshold,UNITY_INT actual,UNITY_COMPARISON_T compare,char *msg,
               UNITY_UINT lineNumber,UNITY_DISPLAY_STYLE_T style)

{
  bool bVar1;
  int failed;
  UNITY_DISPLAY_STYLE_T style_local;
  UNITY_UINT lineNumber_local;
  char *msg_local;
  UNITY_COMPARISON_T compare_local;
  UNITY_INT actual_local;
  UNITY_INT threshold_local;
  
  if (((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) &&
     ((threshold != actual || ((compare & UNITY_EQUAL_TO) == UNITY_WITHIN)))) {
    bVar1 = threshold == actual;
    if ((style & 0x10) == 0x10) {
      if ((threshold < actual) && ((compare & UNITY_SMALLER_THAN) != UNITY_WITHIN)) {
        bVar1 = true;
      }
      if ((actual < threshold) && ((compare & UNITY_GREATER_THAN) != UNITY_WITHIN)) {
        bVar1 = true;
      }
    }
    else {
      if (((ulong)threshold < (ulong)actual) && ((compare & UNITY_SMALLER_THAN) != UNITY_WITHIN)) {
        bVar1 = true;
      }
      if (((ulong)actual < (ulong)threshold) && ((compare & UNITY_GREATER_THAN) != UNITY_WITHIN)) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" Expected ");
      UnityPrintNumberByStyle(actual,style);
      if ((compare & UNITY_GREATER_THAN) != UNITY_WITHIN) {
        UnityPrint(" to be greater than ");
      }
      if ((compare & UNITY_SMALLER_THAN) != UNITY_WITHIN) {
        UnityPrint(" to be less than ");
      }
      if ((compare & UNITY_EQUAL_TO) != UNITY_WITHIN) {
        UnityPrint("or equal to ");
      }
      UnityPrintNumberByStyle(threshold,style);
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
  }
  return;
}

Assistant:

void UnityAssertGreaterOrLessOrEqualNumber(const UNITY_INT threshold,
                                           const UNITY_INT actual,
                                           const UNITY_COMPARISON_T compare,
                                           const char *msg,
                                           const UNITY_LINE_TYPE lineNumber,
                                           const UNITY_DISPLAY_STYLE_T style)
{
    int failed = 0;
    RETURN_IF_FAIL_OR_IGNORE;

    if (threshold == actual && compare & UNITY_EQUAL_TO) return;
    if (threshold == actual) failed = 1;

    if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
    {
        if (actual > threshold && compare & UNITY_SMALLER_THAN) failed = 1;
        if (actual < threshold && compare & UNITY_GREATER_THAN) failed = 1;
    }
    else /* UINT or HEX */
    {
        if ((UNITY_UINT)actual > (UNITY_UINT)threshold && compare & UNITY_SMALLER_THAN) failed = 1;
        if ((UNITY_UINT)actual < (UNITY_UINT)threshold && compare & UNITY_GREATER_THAN) failed = 1;
    }

    if (failed)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        UnityPrintNumberByStyle(actual, style);
        if (compare & UNITY_GREATER_THAN) UnityPrint(UnityStrGt);
        if (compare & UNITY_SMALLER_THAN) UnityPrint(UnityStrLt);
        if (compare & UNITY_EQUAL_TO)     UnityPrint(UnityStrOrEqual);
        UnityPrintNumberByStyle(threshold, style);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}